

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall google::protobuf::Reflection::MaybePoisonAfterClear(Reflection *this,Message *root)

{
  byte bVar1;
  short sVar2;
  Descriptor *pDVar3;
  OneofDescriptor *pOVar4;
  MapDynamicFieldInfo<google::protobuf::Message> info;
  undefined8 uVar5;
  bool bVar6;
  CppStringType CVar7;
  int iVar8;
  uint32_t uVar9;
  ulong uVar10;
  Reflection *pRVar11;
  Message *pMVar12;
  SooRep *this_00;
  RepeatedPtrIterator<google::protobuf::Message> RVar13;
  RepeatedPtrField<google::protobuf::Message> *pRVar14;
  Message *pMVar15;
  Nonnull<const_char_*> pcVar16;
  MapFieldBase *this_01;
  Descriptor *this_02;
  FieldDescriptor *val_f;
  btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
  *pbVar17;
  btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
  *this_03;
  long lVar18;
  long lVar19;
  uint uVar20;
  FieldDescriptor *this_04;
  btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
  *pbVar21;
  _func_int **pp_Var22;
  btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
  *pbVar23;
  string_view str;
  string_view str_00;
  Metadata MVar24;
  iterator_range<google::protobuf::internal::RepeatedPtrIterator<google::protobuf::Message>_> iVar25
  ;
  iterator iVar26;
  iterator iVar27;
  bool heap_alloc;
  vector<MemBlock,_std::allocator<MemBlock>_> nodes;
  Descriptor *extendee;
  queue<google::protobuf::Message_*,_std::deque<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>_>
  queue;
  undefined1 local_189;
  Reflection *local_188;
  Message *local_180;
  RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_google::protobuf::Message>
  local_178;
  undefined1 local_150 [16];
  Reflection *local_140;
  uint32_t *local_138;
  Reflection *local_130;
  Message *pMStack_128;
  FieldDescriptor *local_120;
  RepeatedPtrField<google::protobuf::Message> *pRStack_118;
  ReflectionSchema *local_110;
  void *local_108;
  undefined8 uStack_100;
  long local_f8;
  FieldDescriptor *local_f0;
  uint32_t *local_e8;
  long local_e0;
  DescriptorPool *local_d8;
  undefined1 local_d0 [8];
  _Deque_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_> local_c8;
  MapDynamicFieldInfo<google::protobuf::Message> local_78;
  _func_int *local_48;
  void **local_40;
  _Deque_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_> *local_38;
  
  uVar10 = (root->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar10 & 1) != 0) {
    uVar10 = *(ulong *)(uVar10 & 0xfffffffffffffffe);
  }
  local_189 = uVar10 == 0;
  local_108 = (void *)0x0;
  uStack_100 = 0;
  local_f8 = 0;
  local_140 = (Reflection *)root;
  std::
  vector<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock,std::allocator<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock>>
  ::emplace_back<google::protobuf::Message&>
            ((vector<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock,std::allocator<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock>>
              *)&local_108,root);
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>::
  _M_initialize_map(&local_c8,0);
  local_78.reflection = local_140;
  std::deque<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>::
  emplace_back<google::protobuf::Message*>
            ((deque<google::protobuf::Message*,std::allocator<google::protobuf::Message*>> *)
             &local_c8,(Message **)&local_78);
LAB_0029e9df:
  do {
    do {
      if ((local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
           local_c8._M_impl.super__Deque_impl_data._M_start._M_cur) || ((local_189 & 1) != 0)) {
        (*((MessageLite *)&local_140->descriptor_)->_vptr_MessageLite[2])();
        std::_Deque_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>
        ::~_Deque_base(&local_c8);
        if (local_108 != (void *)0x0) {
          operator_delete(local_108,local_f8 - (long)local_108);
        }
        return;
      }
      pMVar15 = *local_c8._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_c8._M_impl.super__Deque_impl_data._M_start._M_cur ==
          (_Elt_pointer)
          &((Descriptor *)((long)local_c8._M_impl.super__Deque_impl_data._M_start._M_last + -0xa0))
           ->reserved_range_count_) {
        operator_delete(local_c8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_c8._M_impl.super__Deque_impl_data._M_start._M_cur =
             (_Elt_pointer)
             (((Message *)local_c8._M_impl.super__Deque_impl_data._M_start._M_node)->
             super_MessageLite)._internal_metadata_.ptr_;
        local_c8._M_impl.super__Deque_impl_data._M_start._M_last =
             (_Elt_pointer)
             &((OneofDescriptor *)
              ((long)local_c8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x1f8))->all_names_;
        local_c8._M_impl.super__Deque_impl_data._M_start._M_first =
             local_c8._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_c8._M_impl.super__Deque_impl_data._M_start._M_node =
             (_Map_pointer)
             &(((Message *)local_c8._M_impl.super__Deque_impl_data._M_start._M_node)->
              super_MessageLite)._internal_metadata_;
      }
      else {
        local_c8._M_impl.super__Deque_impl_data._M_start._M_cur =
             (_Elt_pointer)((long)local_c8._M_impl.super__Deque_impl_data._M_start._M_cur + 8);
      }
      local_48 = (_func_int *)&local_189;
      local_40 = &local_108;
      local_38 = &local_c8;
      local_150._0_8_ = &local_48;
      local_150._12_4_ = 0x400;
      local_180 = pMVar15;
      MVar24 = Message::GetMetadata(pMVar15);
      pRVar11 = MVar24.reflection;
      if (0 < (pRVar11->schema_).weak_field_map_offset_) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_78,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                   ,99,"!schema.HasWeakFields()");
        str_00._M_str = "weak fields are not supported";
        str_00._M_len = 0x1d;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  ((LogMessage *)&local_78,str_00);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_78);
      }
      if ((pRVar11->schema_).has_bits_offset_ == -1) {
        local_138 = (uint32_t *)0x0;
      }
      else {
        local_138 = GetHasBits(pRVar11,local_180);
      }
      local_110 = &pRVar11->schema_;
      pDVar3 = pRVar11->descriptor_;
      local_e0 = (long)pDVar3->field_count_;
      local_188 = pRVar11;
      if (0 < local_e0) {
        local_e8 = (pRVar11->schema_).has_bit_indices_;
        lVar18 = 0;
        pMVar15 = local_180;
        do {
          if (lVar18 < pDVar3->field_count_) {
            pcVar16 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar16 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (lVar18,(long)pDVar3->field_count_,"index < field_count()");
          }
          if (pcVar16 != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_178,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xa88,pcVar16);
LAB_0029f3cc:
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_178);
          }
          if (((pDVar3->fields_[lVar18].options_)->field_0)._impl_.weak_ == true) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_178,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                       ,0x6e,"!field->options().weak()");
            str._M_str = "weak fields are not supported";
            str._M_len = 0x1d;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      ((LogMessage *)&local_178,str);
            goto LAB_0029f3cc;
          }
          this_04 = pDVar3->fields_ + lVar18;
          if ((local_150._12_4_ != 0xffffffff) &&
             (((uint)local_150._12_4_ >>
               (*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this_04->type_ * 4) & 0x1f) &
              1) == 0)) goto LAB_0029ef43;
          bVar1 = this_04->field_0x1;
          bVar6 = (bool)((bVar1 & 0x20) >> 5);
          if (0xbf < bVar1 == bVar6) {
            pcVar16 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar16 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar6,0xbf < bVar1,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          }
          if (pcVar16 != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_178,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb54,pcVar16);
            goto LAB_0029f3cc;
          }
          if ((this_04->field_0x1 & 0x20) == 0) {
            bVar6 = internal::ReflectionSchema::InRealOneof(local_110,this_04);
            pp_Var22 = (_func_int **)local_150._0_8_;
            if (bVar6) {
              pOVar4 = (this_04->scope_).containing_oneof;
              if (pOVar4 == (OneofDescriptor *)0x0) {
                internal::protobuf_assumption_failed
                          ("res != nullptr",
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                           ,0xb31);
              }
              if ((ulong)*(uint *)((long)&(pMVar15->super_MessageLite)._vptr_MessageLite +
                                  (long)((int)((ulong)((long)pOVar4 -
                                                      (long)pOVar4->containing_type_->oneof_decls_)
                                              >> 3) * -0x49249249) * 4 +
                                  (ulong)(uint)(local_188->schema_).oneof_case_offset_) !=
                  (long)this_04->number_) goto LAB_0029ef43;
              bVar1 = this_04->type_;
              iVar8 = 0xf6;
              if (0x12 < bVar1) goto LAB_0029f39a;
              if ((0x7e1feU >> (bVar1 & 0x1f) & 1) != 0) goto LAB_0029ef43;
              iVar8 = 0xf6;
              if ((0xc00U >> (bVar1 & 0x1f) & 1) == 0) {
LAB_0029ed1d:
                if ((0x1200U >> (bVar1 & 0x1f) & 1) == 0) {
LAB_0029f39a:
                  internal::Unreachable
                            ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                             ,iVar8);
                }
                FieldDescriptor::cpp_string_type(this_04);
              }
              else {
                pRVar11 = (Reflection *)
                          MutableMessage(local_188,pMVar15,this_04,(MessageFactory *)0x0);
                pMVar12 = (pRVar11->schema_).default_instance_;
                if (((ulong)pMVar12 & 1) != 0) {
                  pMVar12 = *(Message **)((ulong)pMVar12 & 0xfffffffffffffffe);
                }
                if (pMVar12 != (Message *)0x0) {
                  std::
                  vector<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock,std::allocator<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock>>
                  ::emplace_back<google::protobuf::Message&>
                            ((vector<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock,std::allocator<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock>>
                              *)pp_Var22[1],(Message *)pRVar11);
                  local_178.reflection = pRVar11;
                  std::deque<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>
                  ::emplace_back<google::protobuf::Message*>
                            ((deque<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>
                              *)pp_Var22[2],(Message **)&local_178);
                  goto LAB_0029ef43;
                }
LAB_0029efa5:
                **pp_Var22 = (_func_int)0x1;
              }
            }
            else if ((local_138 == (uint32_t *)0x0) ||
                    (uVar20 = local_e8[lVar18], uVar20 == 0xffffffff)) {
              bVar6 = HasFieldSingular(local_188,pMVar15,this_04);
              if (bVar6) goto LAB_0029ecee;
            }
            else if ((local_138[uVar20 >> 5] >> (uVar20 & 0x1f) & 1) != 0) {
LAB_0029ecee:
              pp_Var22 = (_func_int **)local_150._0_8_;
              bVar1 = this_04->type_;
              iVar8 = 0x12d;
              if (0x12 < bVar1) goto LAB_0029f39a;
              if ((0x7e1feU >> (bVar1 & 0x1f) & 1) == 0) {
                iVar8 = 0x12d;
                if ((0xc00U >> (bVar1 & 0x1f) & 1) == 0) goto LAB_0029ed1d;
                pRVar11 = (Reflection *)
                          MutableMessage(local_188,pMVar15,this_04,(MessageFactory *)0x0);
                pMVar12 = (pRVar11->schema_).default_instance_;
                if (((ulong)pMVar12 & 1) != 0) {
                  pMVar12 = *(Message **)((ulong)pMVar12 & 0xfffffffffffffffe);
                }
                if (pMVar12 == (Message *)0x0) goto LAB_0029efa5;
                std::
                vector<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock,std::allocator<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock>>
                ::emplace_back<google::protobuf::Message&>
                          ((vector<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock,std::allocator<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock>>
                            *)pp_Var22[1],(Message *)pRVar11);
                local_178.reflection = pRVar11;
                std::deque<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>::
                emplace_back<google::protobuf::Message*>
                          ((deque<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>
                            *)pp_Var22[2],(Message **)&local_178);
              }
            }
            goto LAB_0029ef43;
          }
          switch(this_04->type_) {
          case '\x01':
            this_00 = &GetRawNonOneof<google::protobuf::RepeatedField<double>>
                                 (local_188,pMVar15,this_04)->soo_rep_;
            break;
          case '\x02':
            this_00 = &GetRawNonOneof<google::protobuf::RepeatedField<float>>
                                 (local_188,pMVar15,this_04)->soo_rep_;
            break;
          case '\x03':
          case '\x10':
          case '\x12':
            this_00 = &GetRawNonOneof<google::protobuf::RepeatedField<long>>
                                 (local_188,pMVar15,this_04)->soo_rep_;
            break;
          case '\x04':
          case '\x06':
            this_00 = &GetRawNonOneof<google::protobuf::RepeatedField<unsigned_long>>
                                 (local_188,pMVar15,this_04)->soo_rep_;
            break;
          case '\x05':
          case '\x0e':
          case '\x0f':
          case '\x11':
            this_00 = &GetRawNonOneof<google::protobuf::RepeatedField<int>>
                                 (local_188,pMVar15,this_04)->soo_rep_;
            break;
          case '\a':
          case '\r':
            this_00 = &GetRawNonOneof<google::protobuf::RepeatedField<unsigned_int>>
                                 (local_188,pMVar15,this_04)->soo_rep_;
            break;
          case '\b':
            this_00 = &GetRawNonOneof<google::protobuf::RepeatedField<bool>>
                                 (local_188,pMVar15,this_04)->soo_rep_;
            break;
          case '\t':
          case '\f':
            CVar7 = FieldDescriptor::cpp_string_type(this_04);
            if (CVar7 - kView < 3) {
              GetRawNonOneof<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                        (local_188,pMVar15,this_04);
            }
            goto LAB_0029ef43;
          case '\n':
            pRVar14 = GetRawNonOneof<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                                (local_188,pMVar15,this_04);
            if ((pRVar14->super_RepeatedPtrFieldBase).current_size_ != 0) {
              local_178.reflection = local_188;
              local_178.message = pMVar15;
              local_178.field = this_04;
              local_178.const_repeated = pRVar14;
              iVar25 = internal::
                       RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_google::protobuf::Message>
                       ::Mutable(&local_178);
              for (RVar13 = iVar25.begin_iterator_.it_; uVar5 = local_150._0_8_, pMVar15 = local_180
                  , RVar13.it_ != iVar25.end_iterator_.it_.it_; RVar13.it_ = RVar13.it_ + 1) {
                pRVar11 = (Reflection *)
                          DownCastMessage<google::protobuf::Message>((MessageLite *)*RVar13.it_);
                pMVar15 = (pRVar11->schema_).default_instance_;
                if (((ulong)pMVar15 & 1) != 0) {
                  pMVar15 = *(Message **)((ulong)pMVar15 & 0xfffffffffffffffe);
                }
                if (pMVar15 == (Message *)0x0) {
                  **(_func_int **)uVar5 = (_func_int)0x1;
                }
                else {
                  std::
                  vector<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock,std::allocator<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock>>
                  ::emplace_back<google::protobuf::Message&>
                            (*(vector<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock,std::allocator<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock>>
                               **)(uVar5 + 8),(Message *)pRVar11);
                  local_130 = pRVar11;
                  std::deque<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>
                  ::emplace_back<google::protobuf::Message*>
                            (*(deque<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>
                               **)(uVar5 + 0x10),(Message **)&local_130);
                }
              }
            }
            goto LAB_0029ef43;
          case '\v':
            bVar6 = FieldDescriptor::is_map_message_type(this_04);
            if (bVar6) {
              this_01 = GetRawNonOneof<google::protobuf::internal::MapFieldBase>
                                  (local_188,pMVar15,this_04);
              iVar8 = internal::MapFieldBase::size(this_01);
              if (iVar8 != 0) {
                this_02 = FieldDescriptor::message_type(this_04);
                local_f0 = Descriptor::map_key(this_02);
                val_f = Descriptor::map_value(this_02);
                internal::MapDynamicFieldInfo<google::protobuf::Message>::MapDynamicFieldInfo
                          (&local_78,local_188,pMVar15,this_04,local_f0,val_f,this_01);
                info.message._0_4_ = (int)local_78.message;
                info.reflection = local_78.reflection;
                info.message._4_4_ = (int)((ulong)local_78.message >> 0x20);
                info.field._0_4_ = (int)local_78.field;
                info.field._4_4_ = (int)((ulong)local_78.field >> 0x20);
                info.key._0_4_ = (int)local_78.key;
                info.key._4_4_ = (int)((ulong)local_78.key >> 0x20);
                info.value = local_78.value;
                info.const_map_field = local_78.const_map_field;
                internal::ReflectionVisit::
                VisitMessageFields<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0>(google::protobuf::Message&,google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0&&)
                ::{lambda(auto:1)#1}::operator()((_lambda_auto_1__1_ *)local_150,info);
              }
            }
            else {
              pRVar14 = GetRawNonOneof<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                                  (local_188,pMVar15,this_04);
              if ((pRVar14->super_RepeatedPtrFieldBase).current_size_ != 0) {
                local_178.reflection = local_188;
                local_178.message = pMVar15;
                local_178.field = this_04;
                local_178.const_repeated = pRVar14;
                iVar25 = internal::
                         RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_google::protobuf::Message>
                         ::Mutable(&local_178);
                for (RVar13 = iVar25.begin_iterator_.it_; uVar5 = local_150._0_8_,
                    pMVar15 = local_180, RVar13.it_ != iVar25.end_iterator_.it_.it_;
                    RVar13.it_ = RVar13.it_ + 1) {
                  pRVar11 = (Reflection *)
                            DownCastMessage<google::protobuf::Message>((MessageLite *)*RVar13.it_);
                  pMVar15 = (pRVar11->schema_).default_instance_;
                  if (((ulong)pMVar15 & 1) != 0) {
                    pMVar15 = *(Message **)((ulong)pMVar15 & 0xfffffffffffffffe);
                  }
                  if (pMVar15 == (Message *)0x0) {
                    **(_func_int **)uVar5 = (_func_int)0x1;
                  }
                  else {
                    std::
                    vector<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock,std::allocator<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock>>
                    ::emplace_back<google::protobuf::Message&>
                              (*(vector<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock,std::allocator<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock>>
                                 **)(uVar5 + 8),(Message *)pRVar11);
                    local_130 = pRVar11;
                    std::
                    deque<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>::
                    emplace_back<google::protobuf::Message*>
                              (*(deque<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>
                                 **)(uVar5 + 0x10),(Message **)&local_130);
                  }
                }
              }
            }
            goto LAB_0029ef43;
          default:
            iVar8 = 0xbb;
            goto LAB_0029f39a;
          }
          internal::SooRep::size
                    (this_00,(undefined1  [16])
                             ((undefined1  [16])this_00->field_0 & (undefined1  [16])0x4) ==
                             (undefined1  [16])0x0);
LAB_0029ef43:
          lVar18 = lVar18 + 1;
        } while (lVar18 != local_e0);
      }
      pRVar11 = local_188;
    } while ((local_188->schema_).extensions_offset_ == -1);
    uVar9 = internal::ReflectionSchema::GetExtensionSetOffset(local_110);
    uVar10 = (ulong)uVar9;
    local_d0 = (undefined1  [8])((MessageLite *)&pRVar11->descriptor_)->_vptr_MessageLite;
    local_d8 = pRVar11->descriptor_pool_;
    local_130 = (Reflection *)(local_150 + 0xc);
    pMStack_128 = (Message *)local_150;
    local_120 = (FieldDescriptor *)&local_d8;
    pRStack_118 = (RepeatedPtrField<google::protobuf::Message> *)local_d0;
    sVar2 = *(short *)((long)&(local_180->super_MessageLite)._internal_metadata_.ptr_ + uVar10 + 2);
    this_03 = *(btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                **)((long)&local_180[1].super_MessageLite._vptr_MessageLite + uVar10);
    if ((long)sVar2 < 0) {
      iVar26 = absl::lts_20250127::container_internal::
               btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
               ::begin(this_03);
      iVar27 = absl::lts_20250127::container_internal::
               btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
               ::end(*(btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                       **)((long)&local_180[1].super_MessageLite._vptr_MessageLite + uVar10));
      internal::ExtensionSet::
      ForEachPrefetchImpl<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>&,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>*>,google::protobuf::internal::ReflectionVisit::VisitFields<google::protobuf::Message,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::__0>(google::protobuf::Message&,google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::__0&&)::_lambda(auto:1)_1_>(google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::__0&,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::__0>(google::protobuf::Message&,google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::__0&&)::_lambda(auto:1)_1_&&,google::protobuf::internal::FieldMask)::_lambda(int,auto:1&)_1_,google::protobuf::internal::ExtensionSet::Prefetch>
                (iVar26.node_,iVar26.position_,iVar27.node_,iVar27._8_8_ & 0xffffffff);
      goto LAB_0029e9df;
    }
    lVar18 = (long)sVar2 * 0x20;
    pbVar23 = this_03;
    local_178.reflection = local_130;
    local_178.message = pMStack_128;
    local_178.field = local_120;
    local_178.const_repeated = pRStack_118;
    if (sVar2 != 0) {
      lVar19 = lVar18;
      uVar20 = 0;
      do {
        lVar19 = lVar19 + -0x20;
        internal::ExtensionSet::Extension::PrefetchPtr((Extension *)&pbVar23->rightmost_);
        pbVar23 = (btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                   *)&pbVar23[1].rightmost_;
        if (lVar19 == 0) break;
        bVar6 = uVar20 < 0xf;
        uVar20 = uVar20 + 1;
      } while (bVar6);
    }
    pbVar21 = (btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
               *)(lVar18 + (long)this_03);
    if (pbVar23 != pbVar21) {
      do {
        pbVar17 = this_03;
        internal::ReflectionVisit::
        VisitFields<google::protobuf::Message,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0>(google::protobuf::Message&,google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0&&)::{lambda(auto:1)#1}>(google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0&,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0>(google::protobuf::Message&,google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0&&)::{lambda(auto:1)#1}&&,google::protobuf::internal::FieldMask)
        ::{lambda(int,auto:1&)#1}::operator()
                  (&local_178,*(int *)&pbVar17->root_,(Extension *)&pbVar17->rightmost_);
        internal::ExtensionSet::Extension::PrefetchPtr((Extension *)&pbVar23->rightmost_);
        pbVar23 = (btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                   *)&pbVar23[1].rightmost_;
        this_03 = (btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                   *)&pbVar17[1].rightmost_;
      } while (pbVar23 != pbVar21);
      this_03 = (btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                 *)&pbVar17[1].rightmost_;
    }
    for (; this_03 != pbVar21;
        this_03 = (btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                   *)&this_03[1].rightmost_) {
      internal::ReflectionVisit::
      VisitFields<google::protobuf::Message,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0>(google::protobuf::Message&,google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0&&)::{lambda(auto:1)#1}>(google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0&,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0>(google::protobuf::Message&,google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0&&)::{lambda(auto:1)#1}&&,google::protobuf::internal::FieldMask)
      ::{lambda(int,auto:1&)#1}::operator()
                (&local_178,*(int *)&this_03->root_,(Extension *)&this_03->rightmost_);
    }
  } while( true );
}

Assistant:

void Reflection::MaybePoisonAfterClear(Message& root) const {
  struct MemBlock {
    explicit MemBlock(Message& msg)
        : ptr(static_cast<void*>(&msg)), size(GetSize(msg)) {}

    static uint32_t GetSize(const Message& msg) {
      return msg.GetReflection()->schema_.GetObjectSize();
    }

    void* ptr;
    uint32_t size;
  };

  bool heap_alloc = root.GetArena() == nullptr;
  std::vector<MemBlock> nodes;

#ifdef __cpp_if_constexpr
  nodes.emplace_back(root);

  std::queue<Message*> queue;
  queue.push(&root);

  while (!queue.empty() && !heap_alloc) {
    Message* curr = queue.front();
    queue.pop();
    internal::VisitMutableMessageFields(*curr, [&](Message& msg) {
      if (msg.GetArena() == nullptr) {
        heap_alloc = true;
        return;
      }

      nodes.emplace_back(msg);
      // Also visits child messages.
      queue.push(&msg);
    });
  }
#endif

  root.Clear();

  // Heap allocated oneof messages will be freed on clear. So, poisoning
  // afterwards may cause use-after-free. Bailout.
  if (heap_alloc) return;

  for (auto it : nodes) {
    (void)it;
    internal::PoisonMemoryRegion(it.ptr, it.size);
  }
}